

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_RecordStateDTLS_Test::TestBody
          (SSLVersionTest_RecordStateDTLS_Test *this)

{
  UniquePtr<SSL> *out_client;
  UniquePtr<SSL> *out_server;
  bool bVar1;
  internal iVar2;
  uint16_t uVar3;
  int iVar4;
  uint32_t uVar5;
  ParamType *pPVar6;
  uint64_t uVar7;
  _Head_base<0UL,_ssl_st_*,_false> _Var8;
  SSL *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar9;
  char *in_R9;
  pointer *__ptr_10;
  pointer *__ptr_25;
  pointer *__ptr;
  uint8_t byte_1;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar;
  anon_class_16_2_625711b6 check_matching_secret;
  uint8_t byte;
  uint8_t *data;
  size_t len;
  uint32_t server_hs_seq;
  uint32_t client_hs_seq;
  AssertHelper local_a0;
  _Head_base<0UL,_ssl_st_*,_false> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [8];
  undefined1 local_60 [24];
  AssertHelper local_48;
  uint32_t local_38;
  uint32_t local_34;
  
  pPVar6 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar6->ssl_method != is_dtls) {
    return;
  }
  SSL_CTX_set_current_time_cb
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,CurrentTimeCallback);
  SSL_CTX_set_current_time_cb
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,CurrentTimeCallback);
  out_client = &(this->super_SSLVersionTest).client_;
  out_server = &(this->super_SSLVersionTest).server_;
  bVar1 = CreateClientAndServer
                    (out_client,out_server,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_68[0] = (internal)bVar1;
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)
               "CreateClientAndServer(&client_, &server_, client_ctx_.get(), server_ctx_.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb1f,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  if (!bVar1) {
    return;
  }
  iVar4 = SSL_is_dtls_handshake_idle
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb22,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_is_dtls_handshake_idle
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb23,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  uVar3 = SSL_get_dtls_read_epoch
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_98._M_head_impl._0_2_ = uVar3;
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_88,"SSL_get_dtls_read_epoch(client_.get())","0",
             (unsigned_short *)&local_98,(int *)local_68);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb26,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar3 = SSL_get_dtls_write_epoch
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_98._M_head_impl._0_2_ = uVar3;
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_88,"SSL_get_dtls_write_epoch(server_.get())","0",
             (unsigned_short *)&local_98,(int *)local_68);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb27,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar3 = SSL_get_dtls_read_epoch
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_98._M_head_impl._0_2_ = uVar3;
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_88,"SSL_get_dtls_read_epoch(server_.get())","0",
             (unsigned_short *)&local_98,(int *)local_68);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb28,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar3 = SSL_get_dtls_write_epoch
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_98._M_head_impl._0_2_ = uVar3;
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_88,"SSL_get_dtls_write_epoch(client_.get())","0",
             (unsigned_short *)&local_98,(int *)local_68);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb29,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_read_sequence
                       ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 0)","0u",
             (unsigned_long *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb2c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_write_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 0)","0u",
             (unsigned_long *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb2d,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_read_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 0)","0u",
             (unsigned_long *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb2e,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_write_sequence
                       ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 0)","0u",
             (unsigned_long *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb2f,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar5 = SSL_get_dtls_handshake_read_seq
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_68._0_4_ = uVar5;
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_handshake_read_seq(client_.get())","0u",
             (uint *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb32,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar5 = SSL_get_dtls_handshake_write_seq
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_68._0_4_ = uVar5;
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_handshake_write_seq(server_.get())","0u",
             (uint *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb33,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar5 = SSL_get_dtls_handshake_read_seq
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_68._0_4_ = uVar5;
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_handshake_read_seq(server_.get())","0u",
             (uint *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb34,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  uVar5 = SSL_get_dtls_handshake_write_seq
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_68._0_4_ = uVar5;
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_88,"SSL_get_dtls_handshake_write_seq(client_.get())","0u",
             (uint *)local_68,(uint *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb35,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  iVar4 = SSL_get_dtls_read_traffic_secret
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,0);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 0)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb3b,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_get_dtls_write_traffic_secret
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,0);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 0)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb3d,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_get_dtls_read_traffic_secret
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,0);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 0)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb3e,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_get_dtls_write_traffic_secret
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,0);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 0)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb40,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_read_sequence
                       ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
  local_98._M_head_impl = (ssl_st *)0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 1)",
             "(18446744073709551615UL)",(unsigned_long *)local_68,(unsigned_long *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb43,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_write_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
  local_98._M_head_impl = (ssl_st *)0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 1)",
             "(18446744073709551615UL)",(unsigned_long *)local_68,(unsigned_long *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb44,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_read_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
  local_98._M_head_impl = (ssl_st *)0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 1)",
             "(18446744073709551615UL)",(unsigned_long *)local_68,(unsigned_long *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb45,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_68 = (undefined1  [8])
             SSL_get_dtls_write_sequence
                       ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
  local_98._M_head_impl = (SSL *)0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 1)",
             "(18446744073709551615UL)",(unsigned_long *)local_68,(unsigned_long *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb46,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  iVar4 = SSL_get_dtls_read_traffic_secret
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,1);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb47,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_get_dtls_write_traffic_secret
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,1);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb49,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_get_dtls_read_traffic_secret
                    ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,1);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb4a,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  iVar4 = SSL_get_dtls_write_traffic_secret
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                     (size_t *)&stack0xffffffffffffffc0,1);
  local_68[0] = (internal)(iVar4 == 0);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb4c,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
  }
  if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_
                );
  }
  _Var8._M_head_impl =
       (out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
  iVar2 = (internal)
          CompleteHandshakes(_Var8._M_head_impl,
                             (out_server->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  local_68[0] = iVar2;
  if (!(bool)iVar2) {
    this_00 = (SSL *)local_60;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_68,
               (AssertionResult *)"CompleteHandshakes(client_.get(), server_.get())","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb4e,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    _Var8._M_head_impl = local_98._M_head_impl;
    if (local_98._M_head_impl != (SSL *)0x0) {
      (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
      _Var8._M_head_impl = this_00;
    }
    if (!(bool)iVar2) {
      return;
    }
  }
  bVar1 = SSLVersionTest::is_tls13((SSLVersionTest *)_Var8._M_head_impl);
  if (bVar1) {
    iVar4 = SSL_is_dtls_handshake_idle
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_68[0] = (internal)(iVar4 == 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true","false",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb7b,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    iVar4 = SSL_is_dtls_handshake_idle
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_68[0] = (internal)(iVar4 == 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","true","false",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb7d,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    uVar3 = SSL_get_dtls_read_epoch
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_read_epoch(client_.get())","3",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb80,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar3 = SSL_get_dtls_write_epoch
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_write_epoch(server_.get())","3",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb81,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar3 = SSL_get_dtls_read_epoch
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_read_epoch(server_.get())","3",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb82,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar3 = SSL_get_dtls_write_epoch
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_write_epoch(client_.get())","3",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb83,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])&local_48;
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)&stack0xffffffffffffffc0;
    TestBody::anon_class_16_2_625711b6::operator()
              ((anon_class_16_2_625711b6 *)local_68,
               (out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
               (out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    TestBody::anon_class_16_2_625711b6::operator()
              ((anon_class_16_2_625711b6 *)local_68,
               (out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
               (out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_read_sequence
                   ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,2);
    local_a0.data_ = (AssertHelperData *)0xffffffffffffffff;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 2)",
               "(18446744073709551615UL)",(unsigned_long *)&local_98,(unsigned_long *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb95,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_read_sequence
                   ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,2);
    local_a0.data_ = (AssertHelperData *)0xffffffffffffffff;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 2)",
               "(18446744073709551615UL)",(unsigned_long *)&local_98,(unsigned_long *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb96,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_get_dtls_read_traffic_secret
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                       (size_t *)&stack0xffffffffffffffc0,2);
    local_98._M_head_impl._0_1_ = iVar4 != 0;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_98,
                 (AssertionResult *)
                 "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 2)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb97,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    iVar4 = SSL_get_dtls_read_traffic_secret
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                       (size_t *)&stack0xffffffffffffffc0,2);
    local_98._M_head_impl._0_1_ = iVar4 != 0;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_98,
                 (AssertionResult *)
                 "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 2)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb98,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_write_sequence
                   ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 3)","0u",
               (unsigned_long *)&local_98,(uint *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb9b,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_read_sequence
                   ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 3)","0u",
               (unsigned_long *)&local_98,(uint *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb9c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_write_sequence
                   ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 3)","0u",
               (unsigned_long *)&local_98,(uint *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb9f,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_read_sequence
                   ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 3)","0u",
               (unsigned_long *)&local_98,(uint *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xba0,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_read((SSL *)(out_client->_M_t).
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1);
    local_98._M_head_impl._0_4_ = iVar4;
    local_a0.data_._0_4_ = 0xffffffff;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_read(client_.get(), &byte, 1)","-1",(int *)&local_98,
               (int *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xba5,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_get_error((SSL *)(out_client->_M_t).
                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
    local_98._M_head_impl._0_4_ = iVar4;
    local_a0.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_get_error(client_.get(), -1)","2",(int *)&local_98,
               (int *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xba6,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 1;
    iVar4 = DTLSv1_handle_timeout
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_4_ = iVar4;
    local_a0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"DTLSv1_handle_timeout(client_.get())","1",(int *)&local_98,
               (int *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xba8,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_is_dtls_handshake_idle
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_1_ = iVar4 != 0;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_98,
                 (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbab,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_write_sequence
                   ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_ =
         (AssertHelperData *)
         SSL_get_dtls_read_sequence
                   ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 3)",
               "SSL_get_dtls_read_sequence(client_.get(), 3)",(unsigned_long *)&local_98,
               (unsigned_long *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbaf,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_write_sequence
                   ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 3)","1u",
               (unsigned_long *)&local_98,(uint *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbb2,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_read((SSL *)(out_server->_M_t).
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1);
    local_98._M_head_impl._0_4_ = iVar4;
    local_a0.data_._0_4_ = 0xffffffff;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_read(server_.get(), &byte, 1)","-1",(int *)&local_98,
               (int *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbb5,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_get_error((SSL *)(out_server->_M_t).
                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
    local_98._M_head_impl._0_4_ = iVar4;
    local_a0.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_get_error(server_.get(), -1)","2",(int *)&local_98,
               (int *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbb6,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_is_dtls_handshake_idle
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_1_ = iVar4 != 0;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_98,
                 (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbb9,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_98._M_head_impl =
         (ssl_st *)
         SSL_get_dtls_write_sequence
                   ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_a0.data_ =
         (AssertHelperData *)
         SSL_get_dtls_read_sequence
                   ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 3)",
               "SSL_get_dtls_read_sequence(server_.get(), 3)",(unsigned_long *)&local_98,
               (unsigned_long *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbbd,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar7 = SSL_get_dtls_write_sequence
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
    local_60[0xf] = 0x2a;
    iVar4 = SSL_write((SSL *)(out_server->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1);
    local_98._M_head_impl._0_4_ = iVar4;
    local_a0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_write(server_.get(), &byte, 1)","1",(int *)&local_98,
               (int *)&local_a0);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xbc2,pcVar9);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    }
    else {
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      iVar4 = SSL_read((SSL *)(out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1);
      local_98._M_head_impl._0_4_ = iVar4;
      local_a0.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"SSL_read(client_.get(), &byte, 1)","1",(int *)&local_98,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xbc3,pcVar9);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      }
      else {
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        local_98._M_head_impl =
             (ssl_st *)
             SSL_get_dtls_write_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
        local_a0.data_ = (AssertHelperData *)(uVar7 + 1);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 3)",
                   "old_seq + 1",(unsigned_long *)&local_98,(unsigned_long *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbc4,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        local_98._M_head_impl =
             (ssl_st *)
             SSL_get_dtls_read_sequence
                       ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,3);
        local_a0.data_ = (AssertHelperData *)(uVar7 + 1);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 3)","old_seq + 1"
                   ,(unsigned_long *)&local_98,(unsigned_long *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbc5,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        local_34 = SSL_get_dtls_handshake_write_seq
                             ((out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
        testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                  ((internal *)local_88,"client_hs_seq","0u",&stack0xffffffffffffffcc,
                   (uint *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbca,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar5 = SSL_get_dtls_handshake_read_seq
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = uVar5;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"client_hs_seq",
                   "SSL_get_dtls_handshake_read_seq(server_.get())",&stack0xffffffffffffffcc,
                   (uint *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbcb,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        local_38 = SSL_get_dtls_handshake_write_seq
                             ((out_server->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
        testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                  ((internal *)local_88,"server_hs_seq","0u",&stack0xffffffffffffffc8,
                   (uint *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbcd,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar5 = SSL_get_dtls_handshake_read_seq
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = uVar5;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"server_hs_seq",
                   "SSL_get_dtls_handshake_read_seq(client_.get())",&stack0xffffffffffffffc8,
                   (uint *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbce,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_key_update((out_client->_M_t).
                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
        local_98._M_head_impl._0_1_ = iVar4 != 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_90;
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)"SSL_key_update(client_.get(), 1)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbd2,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          local_80 = local_90;
          if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            return;
          }
          goto LAB_00179808;
        }
        iVar4 = SSL_is_dtls_handshake_idle
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_1_ = iVar4 == 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 != 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbd3,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        iVar4 = SSL_read((SSL *)(out_client->_M_t).
                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1
                        );
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_read(client_.get(), &byte, 1)","-1",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbd7,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_get_error((SSL *)(out_client->_M_t).
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_get_error(client_.get(), -1)","2",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbd8,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_is_dtls_handshake_idle
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_1_ = iVar4 == 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 != 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbd9,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        uVar3 = SSL_get_dtls_write_epoch
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_write_epoch(client_.get())","3",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbdc,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_read((SSL *)(out_server->_M_t).
                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1
                        );
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_read(server_.get(), &byte, 1)","-1",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbe1,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_get_error((SSL *)(out_server->_M_t).
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_get_error(server_.get(), -1)","2",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbe2,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 1;
        iVar4 = DTLSv1_handle_timeout
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"DTLSv1_handle_timeout(server_.get())","1",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbe4,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar3 = SSL_get_dtls_read_epoch
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 4;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_read_epoch(server_.get())","4",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbe5,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        local_98._M_head_impl =
             (ssl_st *)
             SSL_get_dtls_read_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,4);
        local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 4)","0u",
                   (unsigned_long *)&local_98,(uint *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbe6,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_is_dtls_handshake_idle
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_1_ = iVar4 == 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 != 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbe9,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        uVar3 = SSL_get_dtls_write_epoch
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_write_epoch(server_.get())","3",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbea,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_read((SSL *)(out_client->_M_t).
                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1
                        );
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_read(client_.get(), &byte, 1)","-1",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbee,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_get_error((SSL *)(out_client->_M_t).
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_get_error(client_.get(), -1)","2",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbef,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 1;
        iVar4 = DTLSv1_handle_timeout
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"DTLSv1_handle_timeout(client_.get())","1",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbf1,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_is_dtls_handshake_idle
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_1_ = iVar4 != 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbf6,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        uVar3 = SSL_get_dtls_read_epoch
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 4;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_read_epoch(client_.get())","4",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbf7,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar3 = SSL_get_dtls_write_epoch
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 4;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_write_epoch(client_.get())","4",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbf8,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        TestBody::anon_class_16_2_625711b6::operator()
                  ((anon_class_16_2_625711b6 *)local_68,
                   (out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                   (out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,4);
        iVar4 = SSL_read((SSL *)(out_server->_M_t).
                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_60 + 0xf,1
                        );
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_read(server_.get(), &byte, 1)","-1",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xbff,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_get_error((SSL *)(out_server->_M_t).
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
        local_98._M_head_impl._0_4_ = iVar4;
        local_a0.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"SSL_get_error(server_.get(), -1)","2",(int *)&local_98,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc00,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        iVar4 = SSL_is_dtls_handshake_idle
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_1_ = iVar4 != 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc01,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        uVar3 = SSL_get_dtls_read_epoch
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 4;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_read_epoch(server_.get())","4",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc02,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar3 = SSL_get_dtls_write_epoch
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a0.data_._0_2_ = uVar3;
        local_98._M_head_impl._0_4_ = 4;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_88,"SSL_get_dtls_write_epoch(server_.get())","4",
                   (unsigned_short *)&local_a0,(int *)&local_98);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc03,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        TestBody::anon_class_16_2_625711b6::operator()
                  ((anon_class_16_2_625711b6 *)local_68,
                   (out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                   (out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,4);
        iVar4 = SSL_get_dtls_read_traffic_secret
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48
                           ,(size_t *)&stack0xffffffffffffffc0,3);
        local_98._M_head_impl._0_1_ = iVar4 != 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)
                     "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc0a,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        iVar4 = SSL_get_dtls_read_traffic_secret
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48
                           ,(size_t *)&stack0xffffffffffffffc0,3);
        local_98._M_head_impl._0_1_ = iVar4 != 0;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)&local_98,
                     (AssertionResult *)
                     "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 3)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc0b,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_60 + 0x10),(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_88._1_7_,local_88[0]),
                            local_78._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        uVar5 = SSL_get_dtls_handshake_write_seq
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = uVar5;
        local_a0.data_._0_4_ = local_34 + 1;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"SSL_get_dtls_handshake_write_seq(client_.get())",
                   "client_hs_seq + 1",(uint *)&local_98,(uint *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc0e,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar5 = SSL_get_dtls_handshake_read_seq
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = uVar5;
        local_a0.data_._0_4_ = local_34 + 1;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"SSL_get_dtls_handshake_read_seq(server_.get())",
                   "client_hs_seq + 1",(uint *)&local_98,(uint *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc0f,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar5 = SSL_get_dtls_handshake_write_seq
                          ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = uVar5;
        local_a0.data_._0_4_ = local_38 + 1;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"SSL_get_dtls_handshake_write_seq(server_.get())",
                   "server_hs_seq + 1",(uint *)&local_98,(uint *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = "";
          }
          else {
            pcVar9 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc10,pcVar9);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98._M_head_impl != (SSL *)0x0) {
            (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        uVar5 = SSL_get_dtls_handshake_read_seq
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_98._M_head_impl._0_4_ = uVar5;
        local_a0.data_._0_4_ = local_38 + 1;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"SSL_get_dtls_handshake_read_seq(client_.get())",
                   "server_hs_seq + 1",(uint *)&local_98,(uint *)&local_a0);
        if (local_88[0] != (internal)0x0) goto LAB_001797f9;
        testing::Message::Message((Message *)&local_98);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xc11,pcVar9);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    _Var8._M_head_impl = local_98._M_head_impl;
LAB_001797ee:
    if (_Var8._M_head_impl != (ssl_st *)0x0) {
      (*(code *)(*(AssertHelperData **)_Var8._M_head_impl)->file)();
    }
  }
  else {
    iVar4 = SSL_is_dtls_handshake_idle
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_68[0] = (internal)(iVar4 != 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)"SSL_is_dtls_handshake_idle(client_.get())","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb53,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    iVar4 = SSL_is_dtls_handshake_idle
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_68[0] = (internal)(iVar4 != 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)"SSL_is_dtls_handshake_idle(server_.get())","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb54,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    uVar3 = SSL_get_dtls_read_epoch
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_read_epoch(client_.get())","1",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb57,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar3 = SSL_get_dtls_write_epoch
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_write_epoch(server_.get())","1",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb58,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar3 = SSL_get_dtls_read_epoch
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_read_epoch(server_.get())","1",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb59,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    uVar3 = SSL_get_dtls_write_epoch
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_98._M_head_impl._0_2_ = uVar3;
    local_68._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_88,"SSL_get_dtls_write_epoch(client_.get())","1",
               (unsigned_short *)&local_98,(int *)local_68);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb5a,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_read_sequence
                         ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 1)","1u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb5d,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_write_sequence
                         ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 1)","1u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb5e,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_read_sequence
                         ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 1)","1u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb5f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_write_sequence
                         ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 1)","1u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb60,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_get_dtls_read_traffic_secret
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                       (size_t *)&stack0xffffffffffffffc0,1);
    local_68[0] = (internal)(iVar4 == 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)
                 "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb64,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    iVar4 = SSL_get_dtls_write_traffic_secret
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                       (size_t *)&stack0xffffffffffffffc0,1);
    local_68[0] = (internal)(iVar4 == 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)
                 "SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb66,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    iVar4 = SSL_get_dtls_read_traffic_secret
                      ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                       (size_t *)&stack0xffffffffffffffc0,1);
    local_68[0] = (internal)(iVar4 == 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)
                 "SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb68,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    iVar4 = SSL_get_dtls_write_traffic_secret
                      ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                       (size_t *)&stack0xffffffffffffffc0,1);
    local_68[0] = (internal)(iVar4 == 0);
    local_60._0_8_ = (SSL_PROTOCOL_METHOD *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_68,
                 (AssertionResult *)
                 "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb6a,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if (local_98._M_head_impl != (SSL *)0x0) {
        (*(local_98._M_head_impl)->method->ssl_new)(local_98._M_head_impl);
      }
    }
    if ((SSL_PROTOCOL_METHOD *)local_60._0_8_ != (SSL_PROTOCOL_METHOD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._0_8_);
    }
    local_a0.data_ = local_a0.data_ & 0xffffffffffffff00;
    iVar4 = SSL_write((SSL *)(out_client->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_a0,1);
    local_68._0_4_ = iVar4;
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_write(client_.get(), &byte, 1)","1",(int *)local_68,
               (int *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb6e,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    iVar4 = SSL_read((SSL *)(out_server->_M_t).
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_a0,1);
    local_68._0_4_ = iVar4;
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"SSL_read(server_.get(), &byte, 1)","1",(int *)local_68,
               (int *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb6f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_read_sequence
                         ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(client_.get(), 1)","1u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb72,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_write_sequence
                         ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(server_.get(), 1)","1u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb73,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_read_sequence
                         ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_read_sequence(server_.get(), 1)","2u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb74,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_68 = (undefined1  [8])
               SSL_get_dtls_write_sequence
                         ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    local_98._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SSL_get_dtls_write_sequence(client_.get(), 1)","2u",
               (unsigned_long *)local_68,(uint *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb75,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      _Var8._M_head_impl = (ssl_st *)local_68;
      goto LAB_001797ee;
    }
  }
LAB_001797f9:
  if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80;
LAB_00179808:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,local_80);
  return;
}

Assistant:

TEST_P(SSLVersionTest, RecordStateDTLS) {
  if (!is_dtls()) {
    return;
  }

  SSL_CTX_set_current_time_cb(client_ctx_.get(), CurrentTimeCallback);
  SSL_CTX_set_current_time_cb(server_ctx_.get(), CurrentTimeCallback);

  ASSERT_TRUE(CreateClientAndServer(&client_, &server_, client_ctx_.get(),
                                    server_ctx_.get()));

  // The handshake is incomplete.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(server_.get()));

  // The initial epoch is zero.
  EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 0);
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 0);
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 0);
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 0);

  // We have not sent or received any records.
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 0), 0u);
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 0), 0u);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 0), 0u);
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 0), 0u);

  // We have not sent or received any handshake messages.
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(client_.get()), 0u);
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(server_.get()), 0u);
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(server_.get()), 0u);
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(client_.get()), 0u);

  // Though it exists, epoch zero is unencrypted and does not have traffic
  // secrets.
  const uint8_t *data;
  size_t len;
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 0));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 0));
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 0));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 0));

  // Other epochs do not exist yet.
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 1), UINT64_MAX);
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 1), UINT64_MAX);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 1), UINT64_MAX);
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 1), UINT64_MAX);
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1));
  EXPECT_FALSE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1));
  EXPECT_FALSE(
      SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1));

  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));

  // DTLS 1.0 and 1.2 are relative simple.
  if (!is_tls13()) {
    // This handshake is now idle.
    EXPECT_TRUE(SSL_is_dtls_handshake_idle(client_.get()));
    EXPECT_TRUE(SSL_is_dtls_handshake_idle(server_.get()));

    // Both sides of both channels are at epoch 1.
    EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 1);
    EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 1);
    EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 1);
    EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 1);

    // Both sides have sent one record at epoch 1 each (Finished).
    EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 1), 1u);

    // DTLS 1.2 does not use traffic secrets.
    EXPECT_FALSE(
        SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 1));
    EXPECT_FALSE(
        SSL_get_dtls_write_traffic_secret(server_.get(), &data, &len, 1));
    EXPECT_FALSE(
        SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 1));
    EXPECT_FALSE(
        SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 1));

    // Send a record from client to server.
    uint8_t byte = 0;
    EXPECT_EQ(SSL_write(client_.get(), &byte, 1), 1);
    EXPECT_EQ(SSL_read(server_.get(), &byte, 1), 1);

    // Sequence numbers should have updated.
    EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 1), 1u);
    EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 1), 2u);
    EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 1), 2u);
    return;
  }

  // The client sent Finished, which the server ACKed, but the client hasn't
  // consumed the ACK.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));
  // The server sent NewSessionTicket, which the client hasn't consumed yet.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(server_.get()));

  // Both sides of both channels are at epoch 3.
  EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 3);
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 3);
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 3);
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 3);

  auto check_matching_secret = [&](SSL *reader, SSL *writer, uint16_t epoch) {
    ASSERT_TRUE(SSL_get_dtls_read_traffic_secret(reader, &data, &len, epoch));
    auto read_secret = Span(data, len);
    ASSERT_TRUE(SSL_get_dtls_write_traffic_secret(writer, &data, &len, epoch));
    auto write_secret = Span(data, len);
    EXPECT_EQ(Bytes(read_secret), Bytes(write_secret));
  };

  // Traffic secrets at epoch 3 should match.
  check_matching_secret(client_.get(), server_.get(), 3);
  check_matching_secret(server_.get(), client_.get(), 3);

  // Both sides retain read epoch 2 (but not write epoch 2). The server must
  // retain epoch 2 because it does not know the client has seen the ACK and
  // therefore must respond to retransmissions of the client's final flight.
  // The client could discard epoch 2, but our implementation happens not to.
  EXPECT_LT(SSL_get_dtls_read_sequence(client_.get(), 2), UINT64_MAX);
  EXPECT_LT(SSL_get_dtls_read_sequence(server_.get(), 2), UINT64_MAX);
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 2));
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 2));

  // The client has not sent anything over epoch 3.
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 3), 0u);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 3), 0u);

  // The server has (ACK and NewSessionTicket), but the client has not seen it.
  EXPECT_GT(SSL_get_dtls_write_sequence(server_.get(), 3), 0u);
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 3), 0u);

  // Read from the client. No application data, but this will consume the
  // records. We send ACKs on a timer, so advance the clock to flush it.
  uint8_t byte;
  EXPECT_EQ(SSL_read(client_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_READ);
  g_current_time.tv_sec++;
  EXPECT_EQ(DTLSv1_handle_timeout(client_.get()), 1);

  // The client has now picked up the ACK and is idle.
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(client_.get()));

  // The client has caught up to what the server wrote.
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 3),
            SSL_get_dtls_read_sequence(client_.get(), 3));

  // The client saw NewSessionTicket and sent an ACK.
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 3), 1u);

  // Pick up the ACK from the server.
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(server_.get(), -1), SSL_ERROR_WANT_READ);

  // Now the server is also idle.
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(server_.get()));

  // The server has seen the ACK and has caught up to the client.
  EXPECT_EQ(SSL_get_dtls_write_sequence(client_.get(), 3),
            SSL_get_dtls_read_sequence(server_.get(), 3));

  // Exchange some data. Sequence numbers should increment.
  uint64_t old_seq = SSL_get_dtls_write_sequence(server_.get(), 3);
  byte = 42;
  ASSERT_EQ(SSL_write(server_.get(), &byte, 1), 1);
  ASSERT_EQ(SSL_read(client_.get(), &byte, 1), 1);
  EXPECT_EQ(SSL_get_dtls_write_sequence(server_.get(), 3), old_seq + 1);
  EXPECT_EQ(SSL_get_dtls_read_sequence(client_.get(), 3), old_seq + 1);

  // Now that everyone's caught up, handshake sequence numbers should be
  // non-zero and match.
  uint32_t client_hs_seq = SSL_get_dtls_handshake_write_seq(client_.get());
  EXPECT_NE(client_hs_seq, 0u);
  EXPECT_EQ(client_hs_seq, SSL_get_dtls_handshake_read_seq(server_.get()));
  uint32_t server_hs_seq = SSL_get_dtls_handshake_write_seq(server_.get());
  EXPECT_NE(server_hs_seq, 0u);
  EXPECT_EQ(server_hs_seq, SSL_get_dtls_handshake_read_seq(client_.get()));

  // Enqueue a KeyUpdate that requests the peer do the same. The client is now
  // busy.
  ASSERT_TRUE(SSL_key_update(client_.get(), SSL_KEY_UPDATE_REQUESTED));
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));
  // Flush the KeyUpdate to the transport. (We currently flush incidental
  // traffic on read because callers are expected to be constantly reading.)
  // The client has an unacked message, so it is still busy.
  EXPECT_EQ(SSL_read(client_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_READ);
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(client_.get()));

  // KeyUpdates are driven by ACKs, so the client is still at epoch 3.
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 3);

  // Consume the KeyUpdate on the server and wait for the ACK timer. The server
  // has now ACKed the KeyUpdate, advanced to read epoch 4, and sent a KeyUpdate
  // of its own.
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(server_.get(), -1), SSL_ERROR_WANT_READ);
  g_current_time.tv_sec++;
  EXPECT_EQ(DTLSv1_handle_timeout(server_.get()), 1);
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 4);
  EXPECT_EQ(SSL_get_dtls_read_sequence(server_.get(), 4), 0u);

  // The server has an outstanding unacked KeyUpdate, so it is busy.
  EXPECT_FALSE(SSL_is_dtls_handshake_idle(server_.get()));
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 3);

  // Consume the ACK and new KeyUpdate on the client. Wait the ACK timer for the
  // client to flush its ACK.
  EXPECT_EQ(SSL_read(client_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(client_.get(), -1), SSL_ERROR_WANT_READ);
  g_current_time.tv_sec++;
  EXPECT_EQ(DTLSv1_handle_timeout(client_.get()), 1);

  // The client has now seen the ACK to its KeyUpdate, advancing its write
  // state, and seen the server's KeyUpdate, advancing its read state. It is
  // now idle.
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(client_.get()));
  EXPECT_EQ(SSL_get_dtls_read_epoch(client_.get()), 4);
  EXPECT_EQ(SSL_get_dtls_write_epoch(client_.get()), 4);

  // Both sides now have epoch 4 of the client write channel.
  check_matching_secret(/*reader=*/server_.get(), /*writer=*/client_.get(), 4);

  // Finally, consume the ACK on the server. The server applies the KeyUpdate
  // and is also idle.
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), -1);
  EXPECT_EQ(SSL_get_error(server_.get(), -1), SSL_ERROR_WANT_READ);
  EXPECT_TRUE(SSL_is_dtls_handshake_idle(server_.get()));
  EXPECT_EQ(SSL_get_dtls_read_epoch(server_.get()), 4);
  EXPECT_EQ(SSL_get_dtls_write_epoch(server_.get()), 4);

  // Both sides now have epoch 4 of the server write channel.
  check_matching_secret(/*reader=*/client_.get(), /*writer=*/server_.get(), 4);

  // Both sides still retain read epoch 3 because neither side has received data
  // at epoch 4 and cannot be sure the ACK has gotten through.
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3));
  EXPECT_TRUE(SSL_get_dtls_read_traffic_secret(server_.get(), &data, &len, 3));

  // Handshake sequence numbers should have incremented.
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(client_.get()), client_hs_seq + 1);
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(server_.get()), client_hs_seq + 1);
  EXPECT_EQ(SSL_get_dtls_handshake_write_seq(server_.get()), server_hs_seq + 1);
  EXPECT_EQ(SSL_get_dtls_handshake_read_seq(client_.get()), server_hs_seq + 1);
}